

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O3

bool __thiscall
cmAuxSourceDirectoryCommand::InitialPass
          (cmAuxSourceDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  char *pcVar7;
  unsigned_long uVar8;
  long lVar9;
  cmake *pcVar10;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var11;
  cmSourceFile *this_00;
  ulong uVar12;
  unsigned_long dindex;
  Directory dir;
  string sourceListValue;
  string file;
  string tdir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string fullname;
  string ext;
  string base;
  Directory local_150;
  string local_148;
  pointer local_128;
  string local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  string local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_b8;
  string local_98;
  long *local_78 [2];
  long local_68 [2];
  long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
  paVar1 = &local_148.field_2;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  local_100 = args;
  if (local_58 == 0x40) {
    local_148._M_string_length = 0;
    local_148.field_2._M_local_buf[0] = '\0';
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_local_buf[0] = '\0';
    local_128 = pbVar2;
    bVar6 = cmsys::SystemTools::FileIsFullPath((pbVar2->_M_dataplus)._M_p);
    if (bVar6) {
      std::__cxx11::string::_M_assign((string *)&local_f8);
    }
    else {
      pcVar7 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      sVar4 = local_f8._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)sVar4,(ulong)pcVar7);
      std::__cxx11::string::append((char *)&local_f8);
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(local_128->_M_dataplus)._M_p);
    }
    pcVar7 = cmMakefile::GetDefinition
                       ((this->super_cmCommand).Makefile,
                        (local_100->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    sVar4 = local_148._M_string_length;
    if (pcVar7 != (char *)0x0) {
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&local_148,0,(char *)sVar4,(ulong)pcVar7);
    }
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::Directory::Directory(&local_150);
    bVar6 = cmsys::Directory::Load(&local_150,&local_f8);
    if ((bVar6) && (uVar8 = cmsys::Directory::GetNumberOfFiles(&local_150), uVar8 != 0)) {
      dindex = 0;
      do {
        pcVar7 = cmsys::Directory::GetFile(&local_150,dindex);
        std::__cxx11::string::string((string *)&local_120,pcVar7,(allocator *)local_78);
        lVar9 = std::__cxx11::string::rfind((char)&local_120,0x2e);
        if (lVar9 != -1) {
          std::__cxx11::string::substr((ulong)local_78,(ulong)&local_120);
          std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_120);
          pcVar10 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
          if ((local_48 != 0) &&
             (_Var11 = std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 ((pcVar10->SourceFileExtensions).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (pcVar10->SourceFileExtensions).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,local_78),
             _Var11._M_current !=
             (pcVar10->SourceFileExtensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) {
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            pcVar3 = (local_128->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,pcVar3,pcVar3 + local_128->_M_string_length);
            std::__cxx11::string::append((char *)&local_b8);
            std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_120._M_dataplus._M_p);
            this_00 = cmMakefile::GetOrCreateSource
                                ((this->super_cmCommand).Makefile,&local_b8,false);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ABSTRACT","");
            cmSourceFile::SetProperty(this_00,&local_98,"0");
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_d8,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
          }
          if (local_50 != local_40) {
            operator_delete(local_50,local_40[0] + 1);
          }
          if (local_78[0] != local_68) {
            operator_delete(local_78[0],local_68[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        dindex = dindex + 1;
      } while (uVar8 != dindex);
    }
    pbVar5 = local_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar2 = local_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar12 = (long)local_d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_d8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar9 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar2,pbVar5);
    }
    if ((char *)local_148._M_string_length != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_148);
    }
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_120,&local_d8,";");
    std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_120._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,
               (local_100->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,local_148._M_dataplus._M_p);
    cmsys::Directory::~Directory(&local_150);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,
                      CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                               local_f8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == &local_148.field_2) goto LAB_003bb32e;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p == paVar1) goto LAB_003bb32e;
  }
  operator_delete(local_148._M_dataplus._M_p,
                  CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                           local_148.field_2._M_local_buf[0]) + 1);
LAB_003bb32e:
  return local_58 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory.c_str())) {
    tdir = this->Makefile->GetCurrentSourceDirectory();
    tdir += "/";
    tdir += templateDirectory;
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  const char* def = this->Makefile->GetDefinition(args[1]);
  if (def) {
    sourceListValue = def;
  }

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        std::string ext = file.substr(dotpos + 1);
        std::string base = file.substr(0, dotpos);
        // Process only source files
        std::vector<std::string> const& srcExts =
          this->Makefile->GetCMakeInstance()->GetSourceExtensions();
        if (!base.empty() &&
            std::find(srcExts.begin(), srcExts.end(), ext) != srcExts.end()) {
          std::string fullname = templateDirectory;
          fullname += "/";
          fullname += file;
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = this->Makefile->GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(fullname);
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmJoin(files, ";");
  this->Makefile->AddDefinition(args[1], sourceListValue.c_str());
  return true;
}